

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall capnp::FlatMessageBuilder::requireFilled(FlatMessageBuilder *this)

{
  ArrayPtr<const_capnp::word> *this_00;
  word *pwVar1;
  word *pwVar2;
  Fault local_28;
  Fault f;
  FlatMessageBuilder *this_local;
  
  _f = MessageBuilder::getSegmentsForOutput(&this->super_MessageBuilder);
  this_00 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
  pwVar1 = kj::ArrayPtr<const_capnp::word>::end(this_00);
  pwVar2 = kj::ArrayPtr<capnp::word>::end(&this->array);
  if (pwVar1 == pwVar2) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
             ,0x11e,FAILED,"getSegmentsForOutput()[0].end() == array.end()",
             "\"FlatMessageBuilder\'s buffer was too large.\"",
             (char (*) [43])"FlatMessageBuilder\'s buffer was too large.");
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

void FlatMessageBuilder::requireFilled() {
  KJ_REQUIRE(getSegmentsForOutput()[0].end() == array.end(),
          "FlatMessageBuilder's buffer was too large.");
}